

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_getstr(Table *t,TString *key)

{
  Node *n_00;
  TKey *pTVar1;
  TValue *pTVar2;
  TString *x_;
  TValue *io;
  TValue ko;
  TString *key_local;
  Table *t_local;
  int nx;
  TValue *k;
  Node *n;
  Node *local_10;
  
  ko._8_8_ = key;
  if (key->tt != '\x04') {
    if (9 < (key->tt & 0xf)) {
      __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2ae,"const TValue *luaH_getstr(Table *, TString *)");
    }
    ko.value_.b._0_2_ = key->tt | 0x8000;
    io = (TValue *)key;
    if ((key->tt & 0x7f) != (ushort)key->tt) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2ae,"const TValue *luaH_getstr(Table *, TString *)");
    }
    pTVar2 = getgeneric(t,(TValue *)&io);
    return pTVar2;
  }
  n_00 = t->node + (key->hash & t->hmask);
  if (key->tt != '\x04') {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  pTVar1 = &n_00->i_key;
  if ((n_00->i_key).nk.tt_ == 0x8004) {
    if (((n_00->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar1->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((pTVar1->nk).value_.gc)->tt != '\x04') {
      __assert_fail("((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((n_00->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar1->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((TString *)(pTVar1->nk).value_.gc == key) {
      return &n_00->i_val;
    }
  }
  if ((n_00->i_key).nk.next == 0) {
    local_10 = (Node *)&luaO_nilobject_;
  }
  else {
    local_10 = (Node *)luaH_getshortstr_continue(key,n_00);
  }
  return &local_10->i_val;
}

Assistant:

const TValue *luaH_getstr (Table *t, TString *key) {
  if (key->tt == LUA_TSHRSTR)
    return luaH_getshortstr(t, key);
  else {  /* for long strings, use generic case */
    TValue ko;
    setsvalue(cast(lua_State *, NULL), &ko, key);
    return getgeneric(t, &ko);
  }
}